

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenerators::SetupAutoMocTarget
          (cmQtAutoGenerators *this,cmTarget *target,string *autogenTargetName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *configIncludes,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *configDefines)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  cmTarget *pcVar4;
  char *pcVar5;
  pointer config;
  allocator local_149;
  string config_moc_incs;
  string _moc_incs;
  string config_moc_compile_defs;
  string _moc_compile_defs;
  string _moc_options;
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  
  this_00 = target->Makefile;
  std::__cxx11::string::string
            ((string *)&_moc_options,"AUTOMOC_MOC_OPTIONS",(allocator *)&_moc_incs);
  pcVar2 = cmTarget::GetProperty(target,&_moc_options);
  std::__cxx11::string::~string((string *)&_moc_options);
  pcVar5 = "";
  if (pcVar2 != (char *)0x0) {
    pcVar5 = pcVar2;
  }
  std::__cxx11::string::string((string *)&_moc_options,pcVar5,(allocator *)&_moc_incs);
  std::__cxx11::string::string((string *)&_moc_incs,"_moc_options",(allocator *)&local_68);
  cmOutputConverter::EscapeForCMake(&_moc_compile_defs,&_moc_options);
  cmMakefile::AddDefinition(this_00,&_moc_incs,_moc_compile_defs._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&_moc_compile_defs);
  std::__cxx11::string::~string((string *)&_moc_incs);
  std::__cxx11::string::string((string *)&_moc_incs,"_skip_moc",(allocator *)&local_68);
  cmOutputConverter::EscapeForCMake(&_moc_compile_defs,&this->SkipMoc);
  cmMakefile::AddDefinition(this_00,&_moc_incs,_moc_compile_defs._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&_moc_compile_defs);
  std::__cxx11::string::~string((string *)&_moc_incs);
  std::__cxx11::string::string((string *)&_moc_incs,"_moc_headers",(allocator *)&local_68);
  cmOutputConverter::EscapeForCMake(&_moc_compile_defs,&this->Headers);
  cmMakefile::AddDefinition(this_00,&_moc_incs,_moc_compile_defs._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&_moc_compile_defs);
  std::__cxx11::string::~string((string *)&_moc_incs);
  std::__cxx11::string::string
            ((string *)&_moc_incs,"CMAKE_AUTOMOC_RELAXED_MODE",(allocator *)&_moc_compile_defs);
  bVar1 = cmMakefile::IsOn(this_00,&_moc_incs);
  std::__cxx11::string::~string((string *)&_moc_incs);
  std::__cxx11::string::string
            ((string *)&_moc_incs,"_moc_relaxed_mode",(allocator *)&_moc_compile_defs);
  pcVar5 = "FALSE";
  if (bVar1) {
    pcVar5 = "TRUE";
  }
  cmMakefile::AddDefinition(this_00,&_moc_incs,pcVar5);
  std::__cxx11::string::~string((string *)&_moc_incs);
  _moc_incs._M_dataplus._M_p = (pointer)&_moc_incs.field_2;
  _moc_incs._M_string_length = 0;
  _moc_compile_defs._M_dataplus._M_p = (pointer)&_moc_compile_defs.field_2;
  _moc_compile_defs._M_string_length = 0;
  _moc_incs.field_2._M_local_buf[0] = '\0';
  _moc_compile_defs.field_2._M_local_buf[0] = '\0';
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_68,this_00,&configs,true);
  GetCompileDefinitionsAndDirectories(target,&local_68,&_moc_incs,&_moc_compile_defs);
  std::__cxx11::string::string((string *)&config_moc_incs,"_moc_incs",(allocator *)&local_88);
  cmOutputConverter::EscapeForCMake(&config_moc_compile_defs,&_moc_incs);
  cmMakefile::AddDefinition(this_00,&config_moc_incs,config_moc_compile_defs._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&config_moc_compile_defs);
  std::__cxx11::string::~string((string *)&config_moc_incs);
  std::__cxx11::string::string
            ((string *)&config_moc_incs,"_moc_compile_defs",(allocator *)&local_88);
  cmOutputConverter::EscapeForCMake(&config_moc_compile_defs,&_moc_compile_defs);
  cmMakefile::AddDefinition(this_00,&config_moc_incs,config_moc_compile_defs._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&config_moc_compile_defs);
  std::__cxx11::string::~string((string *)&config_moc_incs);
  for (config = configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      config != configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; config = config + 1) {
    config_moc_incs._M_dataplus._M_p = (pointer)&config_moc_incs.field_2;
    config_moc_incs._M_string_length = 0;
    config_moc_incs.field_2._M_local_buf[0] = '\0';
    config_moc_compile_defs._M_dataplus._M_p = (pointer)&config_moc_compile_defs.field_2;
    config_moc_compile_defs._M_string_length = 0;
    config_moc_compile_defs.field_2._M_local_buf[0] = '\0';
    GetCompileDefinitionsAndDirectories(target,config,&config_moc_incs,&config_moc_compile_defs);
    bVar1 = std::operator!=(&config_moc_incs,&_moc_incs);
    if (bVar1) {
      cmOutputConverter::EscapeForCMake(&local_88,&config_moc_incs);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](configIncludes,config);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      if (_moc_incs._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&_moc_incs);
      }
    }
    bVar1 = std::operator!=(&config_moc_compile_defs,&_moc_compile_defs);
    if (bVar1) {
      cmOutputConverter::EscapeForCMake(&local_88,&config_moc_compile_defs);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](configDefines,config);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      if (_moc_compile_defs._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&_moc_compile_defs);
      }
    }
    std::__cxx11::string::~string((string *)&config_moc_compile_defs);
    std::__cxx11::string::~string((string *)&config_moc_incs);
  }
  std::__cxx11::string::string
            ((string *)&config_moc_incs,"_target_qt_version",(allocator *)&config_moc_compile_defs);
  pcVar5 = cmMakefile::GetDefinition(this_00,&config_moc_incs);
  std::__cxx11::string::~string((string *)&config_moc_incs);
  if (*pcVar5 == '4') {
    if (pcVar5[1] != '\0') goto LAB_002a6c25;
    std::__cxx11::string::string
              ((string *)&config_moc_incs,"Qt4::moc",(allocator *)&config_moc_compile_defs);
    pcVar4 = cmMakefile::FindTargetToUse(this_00,&config_moc_incs,false);
    std::__cxx11::string::~string((string *)&config_moc_incs);
    if (pcVar4 == (cmTarget *)0x0) {
      cmSystemTools::Error
                ("Qt4::moc target not found ",(autogenTargetName->_M_dataplus)._M_p,(char *)0x0,
                 (char *)0x0);
      goto LAB_002a6c40;
    }
    std::__cxx11::string::string
              ((string *)&config_moc_incs,"_qt_moc_executable",(allocator *)&local_88);
    std::__cxx11::string::string((string *)&config_moc_compile_defs,"",&local_149);
    pcVar5 = cmTarget::GetLocation(pcVar4,&config_moc_compile_defs);
    cmMakefile::AddDefinition(this_00,&config_moc_incs,pcVar5);
  }
  else {
    if ((*pcVar5 != '5') || (pcVar5[1] != '\0')) {
LAB_002a6c25:
      cmSystemTools::Error
                ("The CMAKE_AUTOMOC feature supports only Qt 4 and Qt 5 ",
                 (autogenTargetName->_M_dataplus)._M_p,(char *)0x0,(char *)0x0);
      goto LAB_002a6c40;
    }
    std::__cxx11::string::string
              ((string *)&config_moc_incs,"Qt5::moc",(allocator *)&config_moc_compile_defs);
    pcVar4 = cmMakefile::FindTargetToUse(this_00,&config_moc_incs,false);
    std::__cxx11::string::~string((string *)&config_moc_incs);
    if (pcVar4 == (cmTarget *)0x0) {
      cmSystemTools::Error
                ("Qt5::moc target not found ",(autogenTargetName->_M_dataplus)._M_p,(char *)0x0,
                 (char *)0x0);
      goto LAB_002a6c40;
    }
    std::__cxx11::string::string
              ((string *)&config_moc_incs,"_qt_moc_executable",(allocator *)&local_88);
    std::__cxx11::string::string((string *)&config_moc_compile_defs,"",&local_149);
    pcVar5 = cmTarget::GetLocation(pcVar4,&config_moc_compile_defs);
    cmMakefile::AddDefinition(this_00,&config_moc_incs,pcVar5);
  }
  std::__cxx11::string::~string((string *)&config_moc_compile_defs);
  std::__cxx11::string::~string((string *)&config_moc_incs);
LAB_002a6c40:
  std::__cxx11::string::~string((string *)&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  std::__cxx11::string::~string((string *)&_moc_compile_defs);
  std::__cxx11::string::~string((string *)&_moc_incs);
  std::__cxx11::string::~string((string *)&_moc_options);
  return;
}

Assistant:

void cmQtAutoGenerators::SetupAutoMocTarget(cmTarget const* target,
                          const std::string &autogenTargetName,
                          std::map<std::string, std::string> &configIncludes,
                          std::map<std::string, std::string> &configDefines)
{
  cmMakefile* makefile = target->GetMakefile();

  const char* tmp = target->GetProperty("AUTOMOC_MOC_OPTIONS");
  std::string _moc_options = (tmp!=0 ? tmp : "");
  makefile->AddDefinition("_moc_options",
          cmOutputConverter::EscapeForCMake(_moc_options).c_str());
  makefile->AddDefinition("_skip_moc",
          cmOutputConverter::EscapeForCMake(this->SkipMoc).c_str());
  makefile->AddDefinition("_moc_headers",
          cmOutputConverter::EscapeForCMake(this->Headers).c_str());
  bool relaxedMode = makefile->IsOn("CMAKE_AUTOMOC_RELAXED_MODE");
  makefile->AddDefinition("_moc_relaxed_mode", relaxedMode ? "TRUE" : "FALSE");

  std::string _moc_incs;
  std::string _moc_compile_defs;
  std::vector<std::string> configs;
  const std::string& config = makefile->GetConfigurations(configs);
  GetCompileDefinitionsAndDirectories(target, config,
                                      _moc_incs, _moc_compile_defs);

  makefile->AddDefinition("_moc_incs",
          cmOutputConverter::EscapeForCMake(_moc_incs).c_str());
  makefile->AddDefinition("_moc_compile_defs",
          cmOutputConverter::EscapeForCMake(_moc_compile_defs).c_str());

  for (std::vector<std::string>::const_iterator li = configs.begin();
       li != configs.end(); ++li)
    {
    std::string config_moc_incs;
    std::string config_moc_compile_defs;
    GetCompileDefinitionsAndDirectories(target, *li,
                                        config_moc_incs,
                                        config_moc_compile_defs);
    if (config_moc_incs != _moc_incs)
      {
      configIncludes[*li] =
                    cmOutputConverter::EscapeForCMake(config_moc_incs);
      if(_moc_incs.empty())
        {
        _moc_incs = config_moc_incs;
        }
      }
    if (config_moc_compile_defs != _moc_compile_defs)
      {
      configDefines[*li] =
            cmOutputConverter::EscapeForCMake(config_moc_compile_defs);
      if(_moc_compile_defs.empty())
        {
        _moc_compile_defs = config_moc_compile_defs;
        }
      }
    }

  const char *qtVersion = makefile->GetDefinition("_target_qt_version");
  if (strcmp(qtVersion, "5") == 0)
    {
    cmTarget *qt5Moc = makefile->FindTargetToUse("Qt5::moc");
    if (!qt5Moc)
      {
      cmSystemTools::Error("Qt5::moc target not found ",
                          autogenTargetName.c_str());
      return;
      }
    makefile->AddDefinition("_qt_moc_executable", qt5Moc->GetLocation(""));
    }
  else if (strcmp(qtVersion, "4") == 0)
    {
    cmTarget *qt4Moc = makefile->FindTargetToUse("Qt4::moc");
    if (!qt4Moc)
      {
      cmSystemTools::Error("Qt4::moc target not found ",
                          autogenTargetName.c_str());
      return;
      }
    makefile->AddDefinition("_qt_moc_executable", qt4Moc->GetLocation(""));
    }
  else
    {
    cmSystemTools::Error("The CMAKE_AUTOMOC feature supports only Qt 4 and "
                        "Qt 5 ", autogenTargetName.c_str());
    }
}